

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O2

void __thiscall BayesianGameBase::AddProbability(BayesianGameBase *this,Index i,double p)

{
  pointer pdVar1;
  double local_20;
  SparseVector *local_18;
  ulong local_10;
  
  if (this->_m_useSparse == true) {
    local_10 = (ulong)i;
    local_18 = &this->_m_jTypeProbsSparse;
    local_20 = p;
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
    ::operator+=((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
                  *)&local_18,&local_20);
  }
  else {
    pdVar1 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[i] = p + pdVar1[i];
  }
  return;
}

Assistant:

void AddProbability(Index i, double p)
            {if(_m_useSparse) _m_jTypeProbsSparse[i]+=p;
                else _m_jTypeProbs[i]+=p;}